

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVGPainter.cpp
# Opt level: O2

void __thiscall
SVGChart::SVGPainter::DrawRotatedText
          (SVGPainter *this,int inX,int inY,float inDegrees,char *inString)

{
  ostream *poVar1;
  undefined1 *puVar2;
  
  puVar2 = &this->field_0x38;
  poVar1 = std::operator<<((ostream *)puVar2,"<text x=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,inX);
  poVar1 = std::operator<<(poVar1,"\" y=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,inY);
  std::operator<<(poVar1,"\" transform=");
  poVar1 = std::operator<<((ostream *)puVar2,"\"rotate(");
  std::ostream::operator<<(poVar1,inDegrees);
  poVar1 = std::operator<<((ostream *)puVar2,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,inX);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,inY);
  std::operator<<(poVar1,")\">");
  poVar1 = std::operator<<((ostream *)puVar2,inString);
  std::operator<<(poVar1,"</text>\n");
  return;
}

Assistant:

void SVGPainter::DrawRotatedText (int inX, int inY, float inDegrees, const char *inString) {
        svgContent << "<text x=\"" << inX << "\" y=\"" << inY << "\" transform=";
        svgContent << "\"rotate(" << inDegrees;
        svgContent << "," << inX << "," << inY << ")\">";
        svgContent << inString << "</text>\n";
    }